

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_marker(stbi__jpeg *z,int m)

{
  byte bVar1;
  stbi__context *psVar2;
  byte bVar3;
  stbi_uc sVar4;
  sbyte sVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  stbi_uc *psVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  byte bVar15;
  long lVar16;
  bool bVar17;
  int sizes [16];
  uint local_78 [18];
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      iVar6 = stbi__get16be(z->s);
      iVar6 = iVar6 + -2;
      do {
        if (iVar6 < 1) goto LAB_001141fc;
        psVar2 = z->s;
        pbVar8 = psVar2->img_buffer;
        if (pbVar8 < psVar2->img_buffer_end) {
LAB_00113f27:
          psVar2->img_buffer = pbVar8 + 1;
          bVar3 = *pbVar8;
        }
        else {
          if (psVar2->read_from_callbacks != 0) {
            psVar9 = psVar2->buffer_start;
            iVar7 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar9,psVar2->buflen);
            if (iVar7 == 0) {
              psVar2->read_from_callbacks = 0;
              psVar2->img_buffer = psVar9;
              psVar2->img_buffer_end = psVar2->buffer_start + 1;
              psVar2->buffer_start[0] = '\0';
            }
            else {
              psVar2->img_buffer = psVar9;
              psVar2->img_buffer_end = psVar9 + iVar7;
            }
            pbVar8 = psVar2->img_buffer;
            goto LAB_00113f27;
          }
          bVar3 = 0;
        }
        bVar15 = bVar3 & 0xf;
        if (bVar15 < 4 && bVar3 < 0x20) {
          lVar16 = 0;
          uVar14 = 0;
          do {
            psVar2 = z->s;
            pbVar8 = psVar2->img_buffer;
            if (pbVar8 < psVar2->img_buffer_end) {
LAB_00113feb:
              psVar2->img_buffer = pbVar8 + 1;
              uVar11 = (uint)*pbVar8;
            }
            else {
              if (psVar2->read_from_callbacks != 0) {
                psVar9 = psVar2->buffer_start;
                iVar7 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar9,psVar2->buflen);
                if (iVar7 == 0) {
                  psVar2->read_from_callbacks = 0;
                  psVar2->img_buffer = psVar9;
                  psVar2->img_buffer_end = psVar2->buffer_start + 1;
                  psVar2->buffer_start[0] = '\0';
                }
                else {
                  psVar2->img_buffer = psVar9;
                  psVar2->img_buffer_end = psVar9 + iVar7;
                }
                pbVar8 = psVar2->img_buffer;
                goto LAB_00113feb;
              }
              uVar11 = 0;
            }
            local_78[lVar16] = uVar11;
            uVar14 = uVar14 + uVar11;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x10);
          iVar6 = iVar6 + -0x11;
          if (bVar3 < 0x10) {
            iVar7 = stbi__build_huffman(z->huff_dc + bVar15,(int *)local_78);
            lVar16 = 8;
          }
          else {
            iVar7 = stbi__build_huffman(z->huff_ac + bVar15,(int *)local_78);
            lVar16 = 0x1a48;
          }
          if (iVar7 == 0) goto LAB_001141f0;
          if (uVar14 != 0) {
            uVar13 = 0;
            do {
              psVar2 = z->s;
              psVar9 = psVar2->img_buffer;
              if (psVar9 < psVar2->img_buffer_end) {
LAB_001140fa:
                psVar2->img_buffer = psVar9 + 1;
                sVar4 = *psVar9;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  psVar9 = psVar2->buffer_start;
                  iVar7 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar9,psVar2->buflen);
                  if (iVar7 == 0) {
                    psVar2->read_from_callbacks = 0;
                    psVar2->img_buffer = psVar9;
                    psVar2->img_buffer_end = psVar2->buffer_start + 1;
                    psVar2->buffer_start[0] = '\0';
                  }
                  else {
                    psVar2->img_buffer = psVar9;
                    psVar2->img_buffer_end = psVar9 + iVar7;
                  }
                  psVar9 = psVar2->img_buffer;
                  goto LAB_001140fa;
                }
                sVar4 = '\0';
              }
              z->huff_dc[bVar15].values[uVar13 + lVar16 + -8] = sVar4;
              uVar13 = uVar13 + 1;
            } while (uVar14 != uVar13);
          }
          if (0xf < bVar3) {
            lVar16 = 0;
            do {
              uVar13 = (ulong)z->huff_ac[bVar15].fast[lVar16];
              z->fast_ac[bVar15][lVar16] = 0;
              if (uVar13 != 0xff) {
                bVar3 = z->huff_ac[bVar15].values[uVar13];
                if ((bVar3 & 0xf) != 0) {
                  bVar1 = z->huff_ac[bVar15].size[uVar13];
                  uVar10 = (bVar3 & 0xf) + (ushort)bVar1;
                  if (uVar10 < 10) {
                    uVar12 = (int)lVar16 << (bVar1 & 0x1f) & 0x1ff;
                    sVar5 = (sbyte)(bVar3 & 0xf);
                    uVar11 = -1 << sVar5 | 1;
                    if (0xff < uVar12) {
                      uVar11 = 0;
                    }
                    iVar7 = uVar11 + (uVar12 >> (9U - sVar5 & 0x1f));
                    if ((char)iVar7 == iVar7) {
                      z->fast_ac[bVar15][lVar16] = (short)iVar7 * 0x100 | bVar3 & 0xfff0 | uVar10;
                    }
                  }
                }
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x200);
          }
          iVar6 = iVar6 - uVar14;
          bVar17 = true;
        }
        else {
          stbi__g_failure_reason = "bad DHT header";
LAB_001141f0:
          bVar17 = false;
        }
      } while (bVar17);
    }
    else if (m == 0xdb) {
      iVar6 = stbi__get16be(z->s);
      iVar6 = iVar6 + -2;
      do {
        if (iVar6 < 1) goto LAB_001141fc;
        psVar2 = z->s;
        pbVar8 = psVar2->img_buffer;
        if (pbVar8 < psVar2->img_buffer_end) {
LAB_00113d2f:
          psVar2->img_buffer = pbVar8 + 1;
          bVar3 = *pbVar8;
        }
        else {
          if (psVar2->read_from_callbacks != 0) {
            psVar9 = psVar2->buffer_start;
            iVar7 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar9,psVar2->buflen);
            if (iVar7 == 0) {
              psVar2->read_from_callbacks = 0;
              psVar2->img_buffer = psVar9;
              psVar2->img_buffer_end = psVar2->buffer_start + 1;
              psVar2->buffer_start[0] = '\0';
            }
            else {
              psVar2->img_buffer = psVar9;
              psVar2->img_buffer_end = psVar9 + iVar7;
            }
            pbVar8 = psVar2->img_buffer;
            goto LAB_00113d2f;
          }
          bVar3 = 0;
        }
        if (bVar3 < 0x10) {
          if (3 < (bVar3 & 0xf)) {
            stbi__g_failure_reason = "bad DQT table";
            goto LAB_00113d5d;
          }
          lVar16 = 0;
          do {
            psVar2 = z->s;
            psVar9 = psVar2->img_buffer;
            if (psVar9 < psVar2->img_buffer_end) {
LAB_00113de3:
              psVar2->img_buffer = psVar9 + 1;
              sVar4 = *psVar9;
            }
            else {
              if (psVar2->read_from_callbacks != 0) {
                psVar9 = psVar2->buffer_start;
                iVar7 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar9,psVar2->buflen);
                if (iVar7 == 0) {
                  psVar2->read_from_callbacks = 0;
                  psVar2->img_buffer = psVar9;
                  psVar2->img_buffer_end = psVar2->buffer_start + 1;
                  psVar2->buffer_start[0] = '\0';
                }
                else {
                  psVar2->img_buffer = psVar9;
                  psVar2->img_buffer_end = psVar9 + iVar7;
                }
                psVar9 = psVar2->img_buffer;
                goto LAB_00113de3;
              }
              sVar4 = '\0';
            }
            z->dequant[bVar3 & 0xf][""[lVar16]] = sVar4;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x40);
          iVar6 = iVar6 + -0x41;
          bVar17 = true;
        }
        else {
          stbi__g_failure_reason = "bad DQT type";
LAB_00113d5d:
          bVar17 = false;
        }
      } while (bVar17);
    }
    else {
LAB_00113e43:
      if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
        psVar2 = z->s;
        iVar6 = stbi__get16be(psVar2);
        stbi__skip(psVar2,iVar6 + -2);
        goto LAB_0011421c;
      }
    }
  }
  else if (m == 0xdd) {
    iVar6 = stbi__get16be(z->s);
    if (iVar6 == 4) {
      iVar6 = stbi__get16be(z->s);
      z->restart_interval = iVar6;
LAB_0011421c:
      bVar17 = true;
      goto LAB_00114230;
    }
    stbi__g_failure_reason = "bad DRI len";
  }
  else {
    if (m != 0xff) goto LAB_00113e43;
    stbi__g_failure_reason = "expected marker";
  }
  bVar17 = false;
LAB_00114230:
  return (int)bVar17;
LAB_001141fc:
  bVar17 = iVar6 == 0;
  goto LAB_00114230;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4;
            int t = q & 15,i;
            if (p != 0) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");
            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = stbi__get8(z->s);
            L -= 65;
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }
   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      stbi__skip(z->s, stbi__get16be(z->s)-2);
      return 1;
   }
   return 0;
}